

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynAlign * ParseAlign(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  int iVar2;
  SynNumber *value;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lexeme *end;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_noalign) {
    ctx->currentLexeme = begin + 1;
    value = (SynNumber *)0x0;
  }
  else {
    if (begin->type != lex_align) {
      return (SynAlign *)0x0;
    }
    ctx->currentLexeme = begin + 1;
    anon_unknown.dwarf_147a9::CheckConsume(ctx,lex_oparen,"ERROR: \'(\' expected after align");
    bVar1 = anon_unknown.dwarf_147a9::CheckAt
                      (ctx,lex_number,"ERROR: alignment value not found after align(");
    if (bVar1) {
      value = ParseNumber(ctx);
    }
    else {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      value = (SynNumber *)CONCAT44(extraout_var,iVar2);
      SynError::SynError((SynError *)value,ctx->currentLexeme,ctx->currentLexeme);
    }
    anon_unknown.dwarf_147a9::CheckConsume
              (ctx,lex_cparen,"ERROR: \')\' expected after alignment value");
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
  end = ParseContext::Previous(ctx);
  SynAlign::SynAlign((SynAlign *)CONCAT44(extraout_var_00,iVar2),begin,end,&value->super_SynBase);
  return (SynAlign *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

SynAlign* ParseAlign(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_align))
	{
		CheckConsume(ctx, lex_oparen, "ERROR: '(' expected after align");

		SynBase *value = NULL;

		if(CheckAt(ctx, lex_number, "ERROR: alignment value not found after align("))
			value = ParseNumber(ctx);
		else
			value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());

		CheckConsume(ctx, lex_cparen, "ERROR: ')' expected after alignment value");

		return new (ctx.get<SynAlign>()) SynAlign(start, ctx.Previous(), value);
	}
	else if(ctx.Consume(lex_noalign))
	{
		return new (ctx.get<SynAlign>()) SynAlign(start, ctx.Previous(), NULL);
	}

	return NULL;
}